

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::serialize_multipart_formdata_item_begin<httplib::MultipartFormData>
                   (string *__return_storage_ptr__,MultipartFormData *item,string *boundary)

{
  pointer pcVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_68,"--",boundary);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_68,"\r\n");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar4) {
    uVar2 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  paVar4 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar4) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_48,"Content-Disposition: form-data; name=\"",&item->name);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_48,"\"");
  local_68._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar5) {
    local_68.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_68._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar4) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  paVar5 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar5) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((item->filename)._M_string_length != 0) {
    std::operator+(&local_48,"; filename=\"",&item->filename);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_48,"\"");
    local_68._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar6 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar6) {
      local_68.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_68._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_68.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_68._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_68._M_dataplus._M_p,local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar4) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar5) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"\r\n");
  if ((item->content_type)._M_string_length != 0) {
    std::operator+(&local_48,"Content-Type: ",&item->content_type);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_48,"\r\n");
    local_68._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar6 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar6) {
      local_68.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_68._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_68.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_68._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_68._M_dataplus._M_p,local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar4) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar5) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"\r\n");
  return __return_storage_ptr__;
}

Assistant:

inline std::string
serialize_multipart_formdata_item_begin(const T &item,
                                        const std::string &boundary) {
  std::string body = "--" + boundary + "\r\n";
  body += "Content-Disposition: form-data; name=\"" + item.name + "\"";
  if (!item.filename.empty()) {
    body += "; filename=\"" + item.filename + "\"";
  }
  body += "\r\n";
  if (!item.content_type.empty()) {
    body += "Content-Type: " + item.content_type + "\r\n";
  }
  body += "\r\n";

  return body;
}